

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBox.cpp
# Opt level: O2

int __thiscall CBBox::Distance(CBBox *this,CPoint *pPoint)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iY;
  uint uVar9;
  int iX;
  uint uVar10;
  
  sVar1 = pPoint->m_iX;
  sVar2 = this->m_iMaxX;
  sVar3 = this->m_iMinX;
  sVar4 = pPoint->m_iY;
  iY = (int)sVar4;
  if (sVar1 < sVar3 || sVar2 < sVar1) {
    iX = (int)sVar1;
    sVar1 = this->m_iMaxY;
    sVar5 = this->m_iMinY;
    if (sVar4 < sVar5 || sVar1 < sVar4) {
      iVar7 = IsInside(this,iX,iY);
      uVar8 = 0;
      if (iVar7 == 0) {
        uVar8 = iX - sVar3;
        uVar6 = -uVar8;
        if (0 < (int)uVar8) {
          uVar6 = uVar8;
        }
        uVar10 = iX - sVar2;
        uVar8 = -uVar10;
        if (0 < (int)uVar10) {
          uVar8 = uVar10;
        }
        if (uVar6 < uVar8) {
          uVar8 = uVar6;
        }
        uVar10 = iY - sVar5;
        uVar6 = -uVar10;
        if (0 < (int)uVar10) {
          uVar6 = uVar10;
        }
        uVar9 = iY - sVar1;
        uVar10 = -uVar9;
        if (0 < (int)uVar9) {
          uVar10 = uVar9;
        }
        if (uVar6 < uVar10) {
          uVar10 = uVar6;
        }
        uVar8 = uVar10 + uVar8;
      }
    }
    else {
      uVar8 = iX - sVar3;
      uVar6 = -uVar8;
      if (0 < (int)uVar8) {
        uVar6 = uVar8;
      }
      uVar10 = iX - sVar2;
      uVar8 = -uVar10;
      if (0 < (int)uVar10) {
        uVar8 = uVar10;
      }
      if (uVar6 < uVar8) {
        uVar8 = uVar6;
      }
    }
  }
  else {
    uVar8 = iY - this->m_iMinY;
    uVar6 = -uVar8;
    if (0 < (int)uVar8) {
      uVar6 = uVar8;
    }
    uVar10 = iY - this->m_iMaxY;
    uVar8 = -uVar10;
    if (0 < (int)uVar10) {
      uVar8 = uVar10;
    }
    if (uVar6 < uVar8) {
      uVar8 = uVar6;
    }
  }
  return uVar8;
}

Assistant:

void CBBox::Expand(int iMaxX, int iMaxY, int iStep)
{
	m_iMinX	=	MAX(0,m_iMinX-iStep);
	m_iMinY	=	MAX(0,m_iMinY-iStep);
	m_iMaxX	=	MIN(iMaxX,m_iMaxX+iStep);
	m_iMaxY	=	MIN(iMaxY,m_iMaxY+iStep);
}